

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O2

size_t ffmpeg_get_total_frames(input_handle *ih)

{
  AVStream *pAVar1;
  ulong uVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  
  pAVar1 = ih->format_context->streams[ih->audio_stream];
  dVar4 = (double)ih->codec_context->sample_rate *
          (((double)(pAVar1->time_base).num * (double)pAVar1->duration) /
          (double)(pAVar1->time_base).den);
  dVar5 = dVar4 + 0.5;
  uVar2 = (ulong)dVar5;
  sVar3 = 0;
  if (0.0 < dVar4) {
    sVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  }
  return sVar3;
}

Assistant:

static size_t
ffmpeg_get_total_frames(struct input_handle *ih)
{
	double tmp =
	    (double)ih->format_context->streams[ih->audio_stream]->duration *
	    (double)ih->format_context->streams[ih->audio_stream]
		->time_base.num /
	    (double)ih->format_context->streams[ih->audio_stream]
		->time_base.den *
	    (double)ih->codec_context->sample_rate;

	return tmp <= 0.0 ? 0 : (size_t)(tmp + 0.5);
}